

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

rcode __thiscall
olc::Renderable::Load(Renderable *this,string *sFile,ResourcePack *pack,bool filter)

{
  rcode rVar1;
  pointer this_00;
  pointer local_48;
  unique_ptr<olc::Decal,_std::default_delete<olc::Decal>_> local_40;
  unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_> local_38;
  undefined1 local_29;
  ResourcePack *pRStack_28;
  bool filter_local;
  ResourcePack *pack_local;
  string *sFile_local;
  Renderable *this_local;
  
  local_29 = filter;
  pRStack_28 = pack;
  pack_local = (ResourcePack *)sFile;
  sFile_local = (string *)this;
  std::make_unique<olc::Sprite>();
  std::unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_>::operator=
            (&this->pSprite,&local_38);
  std::unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_>::~unique_ptr(&local_38);
  this_00 = std::unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_>::operator->
                      (&this->pSprite);
  rVar1 = olc::Sprite::LoadFromFile(this_00,(string *)pack_local,pRStack_28);
  if (rVar1 == OK) {
    local_48 = std::unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_>::get(&this->pSprite);
    std::make_unique<olc::Decal,olc::Sprite*,bool&>((Sprite **)&local_40,(bool *)&local_48);
    std::unique_ptr<olc::Decal,_std::default_delete<olc::Decal>_>::operator=
              (&this->pDecal,&local_40);
    std::unique_ptr<olc::Decal,_std::default_delete<olc::Decal>_>::~unique_ptr(&local_40);
    this_local._4_4_ = OK;
  }
  else {
    std::unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_>::release(&this->pSprite);
    std::unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_>::operator=
              (&this->pSprite,(nullptr_t)0x0);
    this_local._4_4_ = NO_FILE;
  }
  return this_local._4_4_;
}

Assistant:

olc::rcode Renderable::Load(const std::string &sFile, ResourcePack *pack, bool filter)
	{
		pSprite = std::make_unique<olc::Sprite>();
		if (pSprite->LoadFromFile(sFile, pack) == olc::rcode::OK)
		{
			pDecal = std::make_unique<olc::Decal>(pSprite.get(), filter);
			return olc::rcode::OK;
		}
		else
		{
			pSprite.release();
			pSprite = nullptr;
			return olc::rcode::NO_FILE;
		}
	}